

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O2

void * __thiscall tinyxml2::MemPoolT<104>::Alloc(MemPoolT<104> *this)

{
  int iVar1;
  int iVar2;
  Chunk *t;
  Chunk *pCVar3;
  long lVar4;
  bool bVar5;
  
  t = this->_root;
  if (t == (Chunk *)0x0) {
    t = (Chunk *)operator_new(0xfd8);
    memset(t,0,0xfd8);
    DynArray<tinyxml2::MemPoolT<104>::Block_*,_10>::Push(&this->_blockPtrs,(Block *)t);
    lVar4 = 0x26;
    pCVar3 = t;
    while( true ) {
      bVar5 = lVar4 == 0;
      lVar4 = lVar4 + -1;
      if (bVar5) break;
      pCVar3->next = pCVar3 + 1;
      pCVar3 = pCVar3 + 1;
    }
    t[0x26].next = (Chunk *)0x0;
    this->_root = t;
  }
  this->_root = t->next;
  iVar2 = this->_currentAllocs;
  iVar1 = iVar2 + 1;
  this->_currentAllocs = iVar1;
  if (this->_maxAllocs <= iVar2) {
    this->_maxAllocs = iVar1;
  }
  this->_nAllocs = this->_nAllocs + 1;
  this->_nUntracked = this->_nUntracked + 1;
  return t;
}

Assistant:

virtual void* Alloc() {
        if ( !_root ) {
            // Need a new block.
            Block* block = new Block();
            _blockPtrs.Push( block );

            for( int i=0; i<COUNT-1; ++i ) {
                block->chunk[i].next = &block->chunk[i+1];
            }
            block->chunk[COUNT-1].next = 0;
            _root = block->chunk;
        }
        void* result = _root;
        _root = _root->next;

        ++_currentAllocs;
        if ( _currentAllocs > _maxAllocs ) {
            _maxAllocs = _currentAllocs;
        }
        _nAllocs++;
        _nUntracked++;
        return result;
    }